

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinject.h
# Opt level: O3

shared_ptr<Arms> __thiscall
cinject::InstanceStorage<Arms,_cinject::ConstructorFactory<Arms,_void>_>::getInstance
          (InstanceStorage<Arms,_cinject::ConstructorFactory<Arms,_void>_> *this,
          InjectionContext *context)

{
  undefined1 auVar1 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pcVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<Arms> sVar4;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  if (*(char *)((long)&(context->componentStack_).
                       super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1) == '\0') {
    sVar4 = createInstance(this,context);
    in_RDX = sVar4.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    pcVar3 = (context->componentStack_).
             super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pcVar3 == (pointer)0x0) {
      sVar4 = createInstance((InstanceStorage<Arms,_cinject::ConstructorFactory<Arms,_void>_> *)
                             local_28,context);
      p_Var2 = p_Stack_20;
      auVar1 = local_28;
      in_RDX = sVar4.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_28 = (undefined1  [8])0x0;
      p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pcVar3 = (context->componentStack_).
               super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (context->componentStack_).
      super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)auVar1;
      (context->componentStack_).
      super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)p_Var2;
      if (pcVar3 != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar3);
        in_RDX._M_pi = extraout_RDX;
        if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
          in_RDX._M_pi = extraout_RDX_00;
        }
      }
      pcVar3 = (context->componentStack_).
               super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    this->_vptr_InstanceStorage = (_func_int **)pcVar3;
    pcVar3 = (context->componentStack_).
             super__Vector_base<cinject::component_type,_std::allocator<cinject::component_type>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    *(pointer *)&this->field_0x8 = pcVar3;
    if (pcVar3 != (pointer)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(pcVar3->customName)._M_dataplus._M_p =
             *(int *)&(pcVar3->customName)._M_dataplus._M_p + 1;
        UNLOCK();
      }
      else {
        *(int *)&(pcVar3->customName)._M_dataplus._M_p =
             *(int *)&(pcVar3->customName)._M_dataplus._M_p + 1;
      }
    }
  }
  sVar4.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar4.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Arms>)sVar4.super___shared_ptr<Arms,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<TImplementation> getInstance(InjectionContext* context)
    {
        if (!isSingleton_)
        {
            return createInstance(context);
        }

        if (instance_ == nullptr)
        {
            instance_ = createInstance(context);
        }

        return instance_;
    }